

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

Vec4 __thiscall tcu::sRGBA8ToLinear(tcu *this,UVec4 *cs)

{
  uint *puVar1;
  float x_;
  float y_;
  float z_;
  undefined8 extraout_XMM0_Qa;
  ulong uVar2;
  Vec4 VVar3;
  UVec4 *cs_local;
  
  puVar1 = Vector<unsigned_int,_4>::operator[](cs,0);
  x_ = sRGB8ChannelToLinear(*puVar1);
  puVar1 = Vector<unsigned_int,_4>::operator[](cs,1);
  y_ = sRGB8ChannelToLinear(*puVar1);
  puVar1 = Vector<unsigned_int,_4>::operator[](cs,2);
  z_ = sRGB8ChannelToLinear(*puVar1);
  puVar1 = Vector<unsigned_int,_4>::operator[](cs,3);
  uVar2 = (ulong)(uint)y_;
  Vector<float,_4>::Vector((Vector<float,_4> *)this,x_,y_,z_,(float)*puVar1 / 255.0);
  VVar3.m_data[2] = (float)(int)uVar2;
  VVar3.m_data[3] = (float)(int)(uVar2 >> 0x20);
  VVar3.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar3.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar3.m_data;
}

Assistant:

Vec4 sRGBA8ToLinear (const UVec4& cs)
{
	return Vec4(sRGB8ChannelToLinear(cs[0]),
				sRGB8ChannelToLinear(cs[1]),
				sRGB8ChannelToLinear(cs[2]),
				(float)cs[3] / 255.0f);
}